

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScript(BinaryWriterSpec *this,Script *script)

{
  int iVar1;
  _Head_base<0UL,_wabt::Command_*,_false> _Var2;
  long lVar3;
  pointer puVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  Action *action;
  AssertExceptionCommand *assert_exception_command;
  ulong uVar6;
  string_view s;
  string_view s_00;
  string_view filename_00;
  string_view filename_01;
  string_view s_01;
  string_view filename_02;
  string_view filename_03;
  string_view s_02;
  string_view text;
  string_view sVar7;
  string filename;
  CommandType local_54;
  string local_50;
  
  this->script_ = script;
  Stream::Writef(this->json_stream_,"{\"source_filename\": ");
  sVar7._M_str = (this->source_filename_)._M_dataplus._M_p;
  sVar7._M_len = (this->source_filename_)._M_string_length;
  WriteEscapedString(this,sVar7);
  Stream::Writef(this->json_stream_,",\n \"commands\": [\n");
  puVar4 = (this->script_->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->script_->commands).
      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
    local_54 = ~First;
    uVar6 = 0;
    do {
      _Var2._M_head_impl =
           puVar4[uVar6]._M_t.
           super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
           super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
           super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      if (uVar6 != 0) {
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\n");
      }
      Stream::Writef(this->json_stream_,"  {");
      Stream::Writef(this->json_stream_,"\"%s\": ","type");
      Stream::Writef(this->json_stream_,"\"%s\"",
                     _ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                     + *(int *)(
                               _ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                               + (long)(int)(_Var2._M_head_impl)->type * 4));
      Stream::Writef(this->json_stream_,", ");
      switch((_Var2._M_head_impl)->type) {
      case First:
        (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                  (&local_50,this,kWasmExtension);
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)&_Var2._M_head_impl[2]._vptr_Command)
        ;
        Stream::Writef(this->json_stream_,", ");
        if (*(long *)((long)(_Var2._M_head_impl + 3) + 8) != 0) {
          Stream::Writef(this->json_stream_,"\"%s\": ","name");
          s_00._M_str = (char *)_Var2._M_head_impl[3]._vptr_Command;
          s_00._M_len = *(size_t *)((long)(_Var2._M_head_impl + 3) + 8);
          WriteEscapedString(this,s_00);
          Stream::Writef(this->json_stream_,", ");
        }
        Stream::Writef(this->json_stream_,"\"%s\": ","filename");
        filename_00._M_str = extraout_RDX;
        filename_00._M_len = (size_t)local_50._M_dataplus._M_p;
        sVar7 = GetBasename((wabt *)local_50._M_string_length,filename_00);
        WriteEscapedString(this,sVar7);
        filename_01._M_str = local_50._M_dataplus._M_p;
        filename_01._M_len = local_50._M_string_length;
        WriteModule(this,filename_01,(Module *)(_Var2._M_head_impl + 1));
        goto LAB_0011e8f5;
      case ScriptModule:
        (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                  (&local_50,this,kWasmExtension);
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)&_Var2._M_head_impl[2]._vptr_Command)
        ;
        Stream::Writef(this->json_stream_,", ");
        if (*(long *)((long)(_Var2._M_head_impl + 3) + 8) != 0) {
          Stream::Writef(this->json_stream_,"\"%s\": ","name");
          s_01._M_str = (char *)_Var2._M_head_impl[3]._vptr_Command;
          s_01._M_len = *(size_t *)((long)(_Var2._M_head_impl + 3) + 8);
          WriteEscapedString(this,s_01);
          Stream::Writef(this->json_stream_,", ");
        }
        Stream::Writef(this->json_stream_,"\"%s\": ","filename");
        filename_02._M_str = extraout_RDX_00;
        filename_02._M_len = (size_t)local_50._M_dataplus._M_p;
        sVar7 = GetBasename((wabt *)local_50._M_string_length,filename_02);
        WriteEscapedString(this,sVar7);
        filename_03._M_str = local_50._M_dataplus._M_p;
        filename_03._M_len = local_50._M_string_length;
        WriteScriptModule(this,filename_03,(ScriptModule *)_Var2._M_head_impl[0x3d]._vptr_Command);
LAB_0011e8f5:
        this->num_modules_ = this->num_modules_ + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        local_54 = (CommandType)uVar6;
        break;
      case Action:
        action = (Action *)_Var2._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)(uint)(action->loc).field_1.field_0.line);
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,action);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","expected");
        goto LAB_0011e6aa;
      case Register:
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)&_Var2._M_head_impl[4]._vptr_Command)
        ;
        Stream::Writef(this->json_stream_,", ");
        if (*(int *)&_Var2._M_head_impl[5]._vptr_Command == 0) {
          if (*(CommandType *)((long)(_Var2._M_head_impl + 5) + 8) != local_54) {
            __assert_fail("var.index() == last_module_index",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer-spec.cc"
                          ,0x214,
                          "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteCommands()");
          }
        }
        else {
          if (*(int *)&_Var2._M_head_impl[5]._vptr_Command != 1) {
            __assert_fail("is_index()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                          ,0x3b,"Index wabt::Var::index() const");
          }
          Stream::Writef(this->json_stream_,"\"%s\": ","name");
          WriteVar(this,(Var *)(_Var2._M_head_impl + 3));
          Stream::Writef(this->json_stream_,", ");
        }
        Stream::Writef(this->json_stream_,"\"%s\": ","as");
        s_02._M_str = (char *)_Var2._M_head_impl[1]._vptr_Command;
        s_02._M_len = *(size_t *)((long)(_Var2._M_head_impl + 1) + 8);
        WriteEscapedString(this,s_02);
        break;
      case AssertMalformed:
      case AssertInvalid:
      case AssertUnlinkable:
      case AssertUninstantiable:
        text._M_str = *(char **)((long)(_Var2._M_head_impl + 1) + 8);
        text._M_len = (size_t)_Var2._M_head_impl[2]._vptr_Command;
        WriteInvalidModule(this,(ScriptModule *)_Var2._M_head_impl[1]._vptr_Command,text);
        this->num_modules_ = this->num_modules_ + 1;
        break;
      case AssertReturn:
        lVar3 = (long)_Var2._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(lVar3 + 0x18));
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,(Action *)_Var2._M_head_impl[1]._vptr_Command);
        Stream::Writef(this->json_stream_,", ");
        lVar3 = *(long *)((long)(_Var2._M_head_impl + 1) + 8);
        iVar1 = *(int *)(lVar3 + 0x40);
        pcVar5 = "expected";
        if (iVar1 == 0) {
LAB_0011e99c:
          Stream::Writef(this->json_stream_,"\"%s\": ",pcVar5);
        }
        else if (iVar1 == 1) {
          pcVar5 = "either";
          goto LAB_0011e99c;
        }
        WriteConstVector(this,(ConstVector *)(lVar3 + 0x28));
        break;
      case AssertTrap:
      case AssertExhaustion:
        lVar3 = (long)_Var2._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(lVar3 + 0x18));
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,(Action *)_Var2._M_head_impl[1]._vptr_Command);
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","text");
        s._M_str = *(char **)((long)(_Var2._M_head_impl + 1) + 8);
        s._M_len = (size_t)_Var2._M_head_impl[2]._vptr_Command;
        WriteEscapedString(this,s);
        goto LAB_0011e60a;
      case AssertException:
        lVar3 = (long)_Var2._M_head_impl[1]._vptr_Command;
        Stream::Writef(this->json_stream_,"\"%s\": ","line");
        Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(lVar3 + 0x18));
        Stream::Writef(this->json_stream_,", ");
        WriteAction(this,(Action *)_Var2._M_head_impl[1]._vptr_Command);
LAB_0011e60a:
        Stream::Writef(this->json_stream_,", ");
        Stream::Writef(this->json_stream_,"\"%s\": ","expected");
        action = (Action *)_Var2._M_head_impl[1]._vptr_Command;
LAB_0011e6aa:
        WriteActionResultType(this,action);
      }
      Stream::Writef(this->json_stream_,"}");
      uVar6 = uVar6 + 1;
      puVar4 = (this->script_->commands).
               super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->script_->commands).
                                   super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3));
  }
  Stream::Writef(this->json_stream_,"]}\n");
  return (Result)(this->result_).enum_;
}

Assistant:

Result BinaryWriterSpec::WriteScript(const Script& script) {
  script_ = &script;
  WriteCommands();
  return result_;
}